

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

size_t __thiscall Assimp::CFIReaderImpl::parseSequenceLen(CFIReaderImpl *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t sVar4;
  DeadlyImportError *this_00;
  
  pbVar2 = this->dataP;
  pbVar3 = this->dataEnd;
  if (pbVar3 == pbVar2 || (long)pbVar3 - (long)pbVar2 < 0) {
LAB_00620512:
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this->dataP = pbVar2 + 1;
  bVar1 = *pbVar2;
  sVar4 = (size_t)bVar1;
  if ((char)bVar1 < '\0') {
    if (((bVar1 & 0xf0) != 0x80) || ((long)pbVar3 - (long)(pbVar2 + 1) < 2)) goto LAB_00620512;
    sVar4 = (size_t)((uint)pbVar2[1] * 0x100 + ((uint)pbVar2[2] | (bVar1 & 0xf) << 0x10) + 0x80);
    this->dataP = pbVar2 + 3;
  }
  return sVar4;
}

Assistant:

size_t parseSequenceLen() { // C.21
        if (dataEnd - dataP > 0) {
            uint8_t b = *dataP++;
            if (b < 0x80) { // 0....... (C.21.2)
                return b;
            }
            else if ((b & 0xf0) == 0x80) { // 1000.... ........ ........ (C.21.3)
                if (dataEnd - dataP > 1) {
                    size_t result = (((b & 0x0f) << 16) | (dataP[0] << 8) | dataP[1]) + 0x80;
                    dataP += 2;
                    return result;
                }
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }